

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::AttachToGraph
               (aiNode *attach,
               vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               *srcList)

{
  aiNode **__src;
  aiNode *paVar1;
  aiNode **ppaVar2;
  pointer pNVar3;
  uint uVar4;
  int iVar5;
  pointer pNVar6;
  ulong uVar7;
  pointer pNVar8;
  ulong uVar9;
  
  if (attach->mNumChildren == 0) {
    uVar7 = 0;
  }
  else {
    uVar9 = 0;
    do {
      AttachToGraph(attach->mChildren[uVar9],srcList);
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)attach->mNumChildren;
    } while (uVar9 < uVar7);
  }
  uVar4 = (uint)uVar7;
  pNVar3 = (srcList->
           super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pNVar6 = (srcList->
           super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar3 != pNVar6) {
    iVar5 = 0;
    do {
      if (pNVar3->attachToNode == attach) {
        iVar5 = iVar5 + (pNVar3->resolved ^ 1);
      }
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != pNVar6);
    if (iVar5 != 0) {
      ppaVar2 = (aiNode **)operator_new__((ulong)(iVar5 + uVar4) << 3);
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        __src = attach->mChildren;
        memcpy(ppaVar2,__src,uVar7 << 3);
        if (__src != (aiNode **)0x0) {
          operator_delete__(__src);
          uVar4 = attach->mNumChildren;
        }
      }
      attach->mChildren = ppaVar2;
      attach->mNumChildren = iVar5 + uVar4;
      pNVar3 = (srcList->
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pNVar6 = (srcList->
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pNVar6 != pNVar3) {
        ppaVar2 = ppaVar2 + uVar4;
        uVar4 = 1;
        uVar7 = 0;
        do {
          if ((pNVar3[uVar7].attachToNode == attach) &&
             (pNVar8 = pNVar3 + uVar7, pNVar8->resolved == false)) {
            paVar1 = pNVar8->node;
            *ppaVar2 = paVar1;
            paVar1->mParent = attach;
            ppaVar2 = ppaVar2 + 1;
            pNVar8->resolved = true;
            pNVar3 = (srcList->
                     super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pNVar6 = (srcList->
                     super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar7 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar7 < (ulong)((long)pNVar6 - (long)pNVar3 >> 5));
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::AttachToGraph (aiNode* attach, std::vector<NodeAttachmentInfo>& srcList) {
    unsigned int cnt;
    for ( cnt = 0; cnt < attach->mNumChildren; ++cnt ) {
        AttachToGraph( attach->mChildren[ cnt ], srcList );
    }

    cnt = 0;
    for (std::vector<NodeAttachmentInfo>::iterator it = srcList.begin();
         it != srcList.end(); ++it)
    {
        if ((*it).attachToNode == attach && !(*it).resolved)
            ++cnt;
    }

    if (cnt)    {
        aiNode** n = new aiNode*[cnt+attach->mNumChildren];
        if (attach->mNumChildren)   {
            ::memcpy(n,attach->mChildren,sizeof(void*)*attach->mNumChildren);
            delete[] attach->mChildren;
        }
        attach->mChildren = n;

        n += attach->mNumChildren;
        attach->mNumChildren += cnt;

        for (unsigned int i = 0; i < srcList.size();++i)    {
            NodeAttachmentInfo& att = srcList[i];
            if (att.attachToNode == attach && !att.resolved)    {
                *n = att.node;
                (**n).mParent = attach;
                ++n;

                // mark this attachment as resolved
                att.resolved = true;
            }
        }
    }
}